

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

iterator * __thiscall
tcb::unicode::detail::
unicode_view<std::istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>,_std::istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>,_wchar_t,_char16_t>
::iterator::operator++(iterator *this)

{
  byte bVar1;
  bool bVar2;
  code_point u;
  encoded_chars<char16_t> eVar3;
  undefined8 in_RCX;
  istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> last;
  
  bVar1 = this->idx_ + 1;
  this->idx_ = bVar1;
  if ((this->next_chars_).size_ == (uint)bVar1) {
    bVar2 = std::operator!=(&this->first_,&this->last_);
    if (bVar2) {
      last._M_sbuf = (streambuf_type *)(ulong)(this->last_)._M_c;
      last._8_8_ = in_RCX;
      u = utf_traits<wchar_t,4>::
          decode<std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>,std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>
                    ((utf_traits<wchar_t,4> *)&this->first_,
                     (istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)
                     (this->last_)._M_sbuf,last);
      eVar3 = utf_traits<char16_t,_2>::encode(u);
      this->next_chars_ = eVar3;
      this->idx_ = '\0';
    }
  }
  return this;
}

Assistant:

TCB_CONSTEXPR14 iterator& operator++()
        {
            if (++idx_ == next_chars_.size() && first_ != last_) {
                char32_t c = utf_traits<InCharT>::decode(first_, last_);
                next_chars_ = utf_traits<OutCharT>::encode(c);
                idx_ = 0;
            }
            return *this;
        }